

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O0

void TadsHttpRequestHeader::fix_multiline_headers(StringRef *hdrs,int start_ofs)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  __off_t __length;
  int in_ESI;
  StringRef *in_RDI;
  bool bVar4;
  char *endp;
  char *dst;
  char *p;
  bool local_29;
  char *local_20;
  char *local_18;
  
  pcVar2 = StringRef::getend(in_RDI);
  local_18 = StringRef::get(in_RDI);
  local_18 = local_18 + in_ESI;
  local_20 = local_18;
  while (local_18 < pcVar2) {
    if ((*local_18 == '\r') && (local_18[1] == '\n')) {
      local_29 = false;
      if ((local_18[2] != '\0') && (local_29 = false, local_18[2] != '\r')) {
        local_29 = local_18[2] != '\n';
      }
      iVar1 = isspace((uint)local_29);
      if (iVar1 == 0) {
        pcVar3 = local_18 + 1;
        *local_20 = *local_18;
        local_18 = local_18 + 2;
        local_20[1] = *pcVar3;
        local_20 = local_20 + 2;
      }
      else {
        pcVar3 = local_20 + 1;
        *local_20 = ' ';
        local_18 = local_18 + 2;
        while( true ) {
          iVar1 = isspace((int)*local_18);
          bVar4 = false;
          if ((iVar1 != 0) && (bVar4 = false, *local_18 != '\r')) {
            bVar4 = *local_18 != '\n';
          }
          local_20 = pcVar3;
          if (!bVar4) break;
          local_18 = local_18 + 1;
        }
      }
    }
    else {
      if ((*local_18 == '\r') || (*local_18 == '\n')) {
        *local_20 = ' ';
      }
      else {
        *local_20 = *local_18;
      }
      local_18 = local_18 + 1;
      local_20 = local_20 + 1;
    }
  }
  pcVar2 = StringRef::get(in_RDI);
  StringRef::truncate(in_RDI,local_20 + -(long)pcVar2,__length);
  return;
}

Assistant:

static void fix_multiline_headers(StringRef *hdrs, int start_ofs)
    {
        /*
         *   Look for CR LF <space>+ <^space> sequences, and delete the line
         *   breaks in each one.  
         */
        char *p, *dst, *endp = hdrs->getend();
        for (dst = p = hdrs->get() + start_ofs ; p < endp ; )
        {
            /* check for a line break */
            if (*p == '\r' && *(p+1) == '\n')
            {
                /* 
                 *   if the next line starts with whitespace, it's a
                 *   continuation line; otherwise it's a new header 
                 */
                if (isspace(*(p+2) && *(p+2) != '\r' && *(p+2) != '\n'))
                {
                    /* 
                     *   it's a continuation line - replace the CR-LF with a
                     *   single space, then skip all of the whitespace at the
                     *   start of this line 
                     */
                    *dst++ = ' ';
                    for (p += 2 ; isspace(*p) && *p != '\r' && *p != '\n' ;
                         ++p) ;
                }
                else
                {
                    /* it's not a continuation line, so copy it as-is */
                    *dst++ = *p++;
                    *dst++ = *p++;
                }
            }
            else if (*p == '\r' || *p == '\n')
            {
                /* unpaired CR or LF - convert it to a space */
                *dst++ = ' ';
                ++p;
            }
            else
            {
                /* ordinary character - copy it unchanged */
                *dst++ = *p++;
            }
        }
        
        /* set the new size of the headers */
        hdrs->truncate(dst - hdrs->get());
    }